

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

Offset wabt::U32Leb128Length(uint32_t value)

{
  undefined4 local_10;
  undefined4 local_c;
  uint32_t size;
  uint32_t value_local;
  
  local_10 = 0;
  local_c = value;
  do {
    local_c = local_c >> 7;
    local_10 = local_10 + 1;
  } while (local_c != 0);
  return (ulong)local_10;
}

Assistant:

Offset U32Leb128Length(uint32_t value) {
  uint32_t size = 0;
  do {
    value >>= 7;
    size++;
  } while (value != 0);
  return size;
}